

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanMemoryManager::~VulkanMemoryManager(VulkanMemoryManager *this)

{
  unsigned_long uVar1;
  undefined *puVar2;
  bool bVar3;
  reference pvVar4;
  char *pcVar5;
  undefined8 uVar6;
  pointer ppVar7;
  __atomic_base *p_Var8;
  __int_type_conflict3 _Var9;
  Char *pCVar10;
  char **in_stack_fffffffffffffe80;
  undefined1 local_100 [8];
  string msg_1;
  string msg;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  local_b8;
  iterator it;
  MemorySizeFormatter<unsigned_long> local_a8;
  MemorySizeFormatter<unsigned_long> local_90;
  char *local_78;
  MemorySizeFormatter<unsigned_long> local_70;
  MemorySizeFormatter<unsigned_long> local_58;
  undefined1 local_40 [8];
  string _msg;
  unsigned_long PeakHostVisiblePages;
  unsigned_long PeakDeviceLocalPages;
  VulkanMemoryManager *this_local;
  
  this->_vptr_VulkanMemoryManager = (_func_int **)&PTR_OnNewPageCreated_0139c628;
  PeakDeviceLocalPages = (unsigned_long)this;
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,0);
  PeakHostVisiblePages = *pvVar4 / this->m_DeviceLocalPageSize;
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,1);
  _msg.field_2._8_8_ = *pvVar4 / this->m_HostVisiblePageSize;
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakUsedSize,0);
  uVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,0);
  Diligent::FormatMemorySize<unsigned_long>(&local_58,uVar1,2,*pvVar4);
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,0);
  uVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,0);
  Diligent::FormatMemorySize<unsigned_long>(&local_70,uVar1,2,*pvVar4);
  local_78 = " pages)";
  if (PeakHostVisiblePages == 1) {
    local_78 = " page)";
  }
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakUsedSize,1);
  uVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,1);
  Diligent::FormatMemorySize<unsigned_long>(&local_90,uVar1,2,*pvVar4);
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,1);
  uVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,1);
  Diligent::FormatMemorySize<unsigned_long>(&local_a8,uVar1,2,*pvVar4);
  pcVar5 = " pages)";
  if (_msg.field_2._8_8_ == 1) {
    pcVar5 = " page)";
  }
  it.
  super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
             )(_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
               )pcVar5;
  Diligent::
  FormatString<char[22],std::__cxx11::string,char[79],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*,char[71],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
            ((string *)local_40,(Diligent *)"VulkanMemoryManager \'",(char (*) [22])&this->m_MgrName
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              "\' stats:\n                       Peak used/allocated device-local memory size: ",
             (char (*) [79])&local_58,(MemorySizeFormatter<unsigned_long> *)" / ",
             (char (*) [4])&local_70,(MemorySizeFormatter<unsigned_long> *)0xe5b074,
             (char (*) [3])&PeakHostVisiblePages,(unsigned_long *)&local_78,
             (char **)"\n                       Peak used/allocated host-visible memory size: ",
             (char (*) [71])&local_90,(MemorySizeFormatter<unsigned_long> *)" / ",
             (char (*) [4])&local_a8,(MemorySizeFormatter<unsigned_long> *)0xe5b074,
             (char (*) [3])((long)&_msg.field_2 + 8),(unsigned_long *)&it,in_stack_fffffffffffffe80)
  ;
  puVar2 = Diligent::DebugMessageCallback;
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    uVar6 = std::__cxx11::string::c_str();
    (*(code *)puVar2)(0,uVar6,0);
  }
  std::__cxx11::string::~string((string *)local_40);
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_multimap<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>_>
       ::begin(&this->m_Pages);
  while( true ) {
    msg.field_2._8_8_ =
         std::
         unordered_multimap<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>_>
         ::end(&this->m_Pages);
    bVar3 = std::__detail::operator!=
                      (&local_b8,
                       (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                        *)((long)&msg.field_2 + 8));
    if (!bVar3) break;
    ppVar7 = std::__detail::
             _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
                           *)&local_b8);
    bVar3 = VulkanMemoryPage::IsEmpty(&ppVar7->second);
    if (!bVar3) {
      Diligent::FormatString<char[42]>
                ((string *)((long)&msg_1.field_2 + 8),
                 (char (*) [42])"The page contains outstanding allocations");
      pCVar10 = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (pCVar10,"~VulkanMemoryManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                 ,0x105);
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
    }
    std::__detail::
    _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
                  *)&local_b8);
  }
  p_Var8 = (__atomic_base *)std::array<std::atomic<long>,_2UL>::operator[](&this->m_CurrUsedSize,0);
  _Var9 = std::__atomic_base::operator_cast_to_long(p_Var8);
  if (_Var9 == 0) {
    p_Var8 = (__atomic_base *)
             std::array<std::atomic<long>,_2UL>::operator[](&this->m_CurrUsedSize,1);
    _Var9 = std::__atomic_base::operator_cast_to_long(p_Var8);
    if (_Var9 == 0) goto LAB_00385b8b;
  }
  Diligent::FormatString<char[39]>
            ((string *)local_100,(char (*) [39])"Not all allocations have been released");
  pCVar10 = (Char *)std::__cxx11::string::c_str();
  Diligent::DebugAssertionFailed
            (pCVar10,"~VulkanMemoryManager",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
             ,0x106);
  std::__cxx11::string::~string((string *)local_100);
LAB_00385b8b:
  std::
  unordered_multimap<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>_>
  ::~unordered_multimap(&this->m_Pages);
  std::__cxx11::string::~string((string *)&this->m_MgrName);
  return;
}

Assistant:

VulkanMemoryManager::~VulkanMemoryManager()
{
    auto PeakDeviceLocalPages = m_PeakAllocatedSize[0] / m_DeviceLocalPageSize;
    auto PeakHostVisiblePages = m_PeakAllocatedSize[1] / m_HostVisiblePageSize;
    LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "' stats:\n"
                                                         "                       Peak used/allocated device-local memory size: ",
                     Diligent::FormatMemorySize(m_PeakUsedSize[0], 2, m_PeakAllocatedSize[0]), " / ",
                     Diligent::FormatMemorySize(m_PeakAllocatedSize[0], 2, m_PeakAllocatedSize[0]),
                     " (", PeakDeviceLocalPages, (PeakDeviceLocalPages == 1 ? " page)" : " pages)"),
                     "\n                       Peak used/allocated host-visible memory size: ",
                     Diligent::FormatMemorySize(m_PeakUsedSize[1], 2, m_PeakAllocatedSize[1]), " / ",
                     Diligent::FormatMemorySize(m_PeakAllocatedSize[1], 2, m_PeakAllocatedSize[1]),
                     " (", PeakHostVisiblePages, (PeakHostVisiblePages == 1 ? " page)" : " pages)"));

    for (auto it = m_Pages.begin(); it != m_Pages.end(); ++it)
        VERIFY(it->second.IsEmpty(), "The page contains outstanding allocations");
    VERIFY(m_CurrUsedSize[0] == 0 && m_CurrUsedSize[1] == 0, "Not all allocations have been released");
}